

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.h
# Opt level: O0

void __thiscall HuffmanDecoder::HuffmanDecoder(HuffmanDecoder *this,string *message)

{
  string local_38;
  string *local_18;
  string *message_local;
  HuffmanDecoder *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)message);
  Cryptor::Cryptor(&this->super_Cryptor,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__HuffmanDecoder_00121b68;
  std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
  list(&this->nodes_);
  return;
}

Assistant:

explicit HuffmanDecoder(const std::string& message) : Cryptor(message) {}